

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

void pop_up_built_in_dialog_proc(Am_Object *param_1)

{
  Am_Value_List *pAVar1;
  Am_String local_58 [24];
  Am_Value_List local_40 [16];
  Am_Value_List local_30 [16];
  undefined1 local_20 [8];
  Am_Value value;
  Am_Object *param_0_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)param_1;
  Am_Value_List::Am_Value_List(local_40);
  pAVar1 = (Am_Value_List *)Am_Value_List::Add(local_40,"Type a string to return:",1);
  Am_Value_List::Am_Value_List(local_30,pAVar1);
  Am_String::Am_String(local_58,"",true);
  Am_Get_Input_From_Dialog(local_20,local_30,local_58,0xffffd8f0,0xffffd8f0,1);
  Am_String::~Am_String(local_58);
  Am_Value_List::~Am_Value_List(local_30);
  Am_Value_List::~Am_Value_List(local_40);
  Set_Value_Into_String((Am_Value *)local_20);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, pop_up_built_in_dialog,
		 (Am_Object /* cmd */)) {
  Am_Value value =
    Am_Get_Input_From_Dialog (Am_Value_List().Add("Type a string to return:"));
  //now convert the value into a string for the pop_up_value_string
  Set_Value_Into_String(value);
}